

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O0

void visit_flow_if_stmt(gvisitor_t *self,gnode_flow_stmt_t *node)

{
  long *plVar1;
  ircode_t *code_00;
  uint32_t p1;
  uint32_t p2;
  uint32_t p1_00;
  uint32_t local_84;
  uint32_t local_74;
  uint32_t local_64;
  uint32_t local_54;
  uint32_t reg;
  uint32_t labelFalse;
  uint32_t labelTrue;
  ircode_t *code;
  gravity_function_t *context_function;
  gravity_object_t *context_object;
  gnode_flow_stmt_t *node_local;
  gvisitor_t *self_local;
  
  plVar1 = *(long **)(*(long *)((long)self->data + 0x10) + (*self->data + -1) * 8);
  if ((plVar1 == (long *)0x0) || ((gravity_class_t *)*plVar1 != gravity_class_function)) {
    report_error(self,&node->base,"Invalid code context.");
  }
  else {
    code_00 = (ircode_t *)plVar1[0x14];
    p1 = ircode_newlabel(code_00);
    p2 = ircode_newlabel(code_00);
    gvisit(self,node->cond);
    p1_00 = ircode_register_pop(code_00);
    if (p1_00 == 0xffffffff) {
      report_error(self,&node->base,"Invalid if condition expression.");
    }
    if (node == (gnode_flow_stmt_t *)0x0) {
      local_54 = 0;
    }
    else {
      local_54 = (node->base).token.lineno;
    }
    ircode_add(code_00,JUMPF,p1_00,p2,0,local_54);
    gvisit(self,node->stmt);
    if (node->elsestmt != (gnode_t *)0x0) {
      if (node == (gnode_flow_stmt_t *)0x0) {
        local_64 = 0;
      }
      else {
        local_64 = (node->base).token.lineno;
      }
      ircode_add(code_00,JUMP,p1,0,0,local_64);
    }
    if (node == (gnode_flow_stmt_t *)0x0) {
      local_74 = 0;
    }
    else {
      local_74 = (node->base).token.lineno;
    }
    ircode_marklabel(code_00,p2,local_74);
    if (node->elsestmt != (gnode_t *)0x0) {
      gvisit(self,node->elsestmt);
      if (node == (gnode_flow_stmt_t *)0x0) {
        local_84 = 0;
      }
      else {
        local_84 = (node->base).token.lineno;
      }
      ircode_marklabel(code_00,p1,local_84);
    }
  }
  return;
}

Assistant:

static void visit_flow_if_stmt (gvisitor_t *self, gnode_flow_stmt_t *node) {
    DEBUG_CODEGEN("visit_flow_if_stmt");
    DECLARE_CODE();

    /*
         <condition>
         if-false: goto $end
         <then-part>
         goto $true
         $end:
         <else-part>
         $true:

         TRUE  := getLabel
         FALSE := getLabel
         compile condition
         emit ifeq FALSE
         compile stm1
         emit goto TRUE
         emit FALSE
         compile stm2
         emit TRUE
     */

    uint32_t labelTrue  = ircode_newlabel(code);
    uint32_t labelFalse = ircode_newlabel(code);

    visit(node->cond);
    uint32_t reg = ircode_register_pop(code);
    if (reg == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid if condition expression.");
	ircode_add(code, JUMPF, reg, labelFalse, 0, LINE_NUMBER(node));

    visit(node->stmt);
	if (node->elsestmt) ircode_add(code, JUMP, labelTrue, 0, 0, LINE_NUMBER(node));

	ircode_marklabel(code, labelFalse, LINE_NUMBER(node));
    if (node->elsestmt) {
        visit(node->elsestmt);
		ircode_marklabel(code, labelTrue, LINE_NUMBER(node));
    }
}